

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Builder output_00;
  Reader reader_02;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  bool bVar1;
  word *pwVar2;
  size_t sVar3;
  uint *__nbytes;
  size_t extraout_RDX;
  ulong uVar4;
  ulong count;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_char> input_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> array;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  StringPtr input_01;
  ReaderOptions options;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  Fault f;
  ArrayPtr<const_capnp::word> segments [1];
  Array<capnp::word> words;
  void *pvStack_410;
  WirePointer *local_408;
  undefined8 uStack_400;
  Vector<unsigned_char> allBytes;
  WirePointer *pWStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  word dummy;
  SegmentArrayMessageReader message;
  Reader local_278;
  Reader local_248;
  Reader local_218;
  Reader local_1e8;
  ArrayPtr<const_capnp::word> segments_1 [1];
  ParseErrorCatcher parseErrorCatcher;
  
  ParseErrorCatcher::ParseErrorCatcher(&parseErrorCatcher,this->context);
  __nbytes = &switchD_001e3d9d::switchdataD_0028a54c;
  switch(this->convertFrom) {
  case BINARY:
    options_01._8_8_ = 0x7fffffff;
    options_01.traversalLimitInWords = 0xffffffffffffffff;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)&message,(InputStream *)input,options_01,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRoot<capnp::AnyStruct>(&local_1e8,&message.super_MessageReader);
    reader_00._reader.capTable = local_1e8._reader.capTable;
    reader_00._reader.segment = local_1e8._reader.segment;
    reader_00._reader.data = local_1e8._reader.data;
    reader_00._reader.pointers = local_1e8._reader.pointers;
    reader_00._reader.dataSize = local_1e8._reader.dataSize;
    reader_00._reader.pointerCount = local_1e8._reader.pointerCount;
    reader_00._reader._38_2_ = local_1e8._reader._38_2_;
    reader_00._reader.nestingLimit = local_1e8._reader.nestingLimit;
    reader_00._reader._44_4_ = local_1e8._reader._44_4_;
    writeConversion(this,reader_00,output);
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)&message);
    break;
  case PACKED:
    options_02._8_8_ = 0x7fffffff;
    options_02.traversalLimitInWords = 0xffffffffffffffff;
    PackedMessageReader::PackedMessageReader
              ((PackedMessageReader *)&message,&input->super_BufferedInputStream,options_02,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRoot<capnp::AnyStruct>
              (&local_218,(MessageReader *)&message.super_MessageReader.options.nestingLimit);
    reader_01._reader.capTable = local_218._reader.capTable;
    reader_01._reader.segment = local_218._reader.segment;
    reader_01._reader.data = local_218._reader.data;
    reader_01._reader.pointers = local_218._reader.pointers;
    reader_01._reader.dataSize = local_218._reader.dataSize;
    reader_01._reader.pointerCount = local_218._reader.pointerCount;
    reader_01._reader._38_2_ = local_218._reader._38_2_;
    reader_01._reader.nestingLimit = local_218._reader.nestingLimit;
    reader_01._reader._44_4_ = local_218._reader._44_4_;
    writeConversion(this,reader_01,output);
    PackedMessageReader::~PackedMessageReader((PackedMessageReader *)&message);
    break;
  case FLAT:
  case CANONICAL:
    readAll(&allBytes,this,input);
    uVar4 = (long)allBytes.builder.pos - (long)allBytes.builder.ptr;
    count = uVar4 >> 3;
    pwVar2 = kj::_::HeapArrayDisposer::allocate<capnp::word>(count);
    words.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    words.ptr = pwVar2;
    words.size_ = count;
    memcpy(pwVar2,allBytes.builder.ptr,uVar4 & 0xfffffffffffffff8);
    segments_00.size_ = 1;
    segments_00.ptr = segments;
    options._8_8_ = 0x7fffffff;
    options.traversalLimitInWords = 0xffffffffffffffff;
    segments[0].ptr = pwVar2;
    segments[0].size_ = count;
    SegmentArrayMessageReader::SegmentArrayMessageReader(&message,segments_00,options);
    if ((this->convertFrom == CANONICAL) &&
       (bVar1 = MessageReader::isCanonical(&message.super_MessageReader), !bVar1)) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x402,FAILED,"message.isCanonical()","");
      kj::_::Debug::Fault::fatal(&f);
    }
    MessageReader::getRoot<capnp::AnyStruct>(&local_248,&message.super_MessageReader);
    reader._reader.capTable = local_248._reader.capTable;
    reader._reader.segment = local_248._reader.segment;
    reader._reader.data = local_248._reader.data;
    reader._reader.pointers = local_248._reader.pointers;
    reader._reader.dataSize = local_248._reader.dataSize;
    reader._reader.pointerCount = local_248._reader.pointerCount;
    reader._reader._38_2_ = local_248._reader._38_2_;
    reader._reader.nestingLimit = local_248._reader.nestingLimit;
    reader._reader._44_4_ = local_248._reader._44_4_;
    writeConversion(this,reader,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader(&message);
    kj::Array<capnp::word>::~Array(&words);
    kj::ArrayBuilder<unsigned_char>::dispose(&allBytes.builder);
    break;
  case FLAT_PACKED:
    readAll(&allBytes,this,input);
    packedBytes.ptr = allBytes.builder.pos + -(long)allBytes.builder.ptr;
    packedBytes.size_ = extraout_RDX;
    sVar3 = computeUnpackedSizeInWords((capnp *)allBytes.builder.ptr,packedBytes);
    words.ptr = kj::_::HeapArrayDisposer::allocate<capnp::word>(sVar3);
    words.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    array.size_ = (long)allBytes.builder.pos - (long)allBytes.builder.ptr;
    array.ptr = allBytes.builder.ptr;
    words.size_ = sVar3;
    kj::ArrayInputStream::ArrayInputStream((ArrayInputStream *)segments,array);
    capnp::_::PackedInputStream::PackedInputStream
              ((PackedInputStream *)&f,(BufferedInputStream *)segments);
    kj::InputStream::read
              ((InputStream *)&f,(int)words.ptr,(void *)(words.size_ << 3),(size_t)__nbytes);
    sVar3 = capnp::_::PackedInputStream::tryRead((PackedInputStream *)&f,&dummy,8,8);
    if (sVar3 != 0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&message,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x40e,FAILED,"unpacker.tryRead(&dummy, sizeof(dummy), sizeof(dummy)) == 0","");
      kj::_::Debug::Fault::fatal((Fault *)&message);
    }
    segments_1[0].ptr = words.ptr;
    segments_1[0].size_ = words.size_;
    segments_01.size_ = 1;
    segments_01.ptr = segments_1;
    options_00._8_8_ = 0x7fffffff;
    options_00.traversalLimitInWords = 0xffffffffffffffff;
    SegmentArrayMessageReader::SegmentArrayMessageReader(&message,segments_01,options_00);
    MessageReader::getRoot<capnp::AnyStruct>(&local_278,&message.super_MessageReader);
    reader_03._reader.capTable = local_278._reader.capTable;
    reader_03._reader.segment = local_278._reader.segment;
    reader_03._reader.data = local_278._reader.data;
    reader_03._reader.pointers = local_278._reader.pointers;
    reader_03._reader.dataSize = local_278._reader.dataSize;
    reader_03._reader.pointerCount = local_278._reader.pointerCount;
    reader_03._reader._38_2_ = local_278._reader._38_2_;
    reader_03._reader.nestingLimit = local_278._reader.nestingLimit;
    reader_03._reader._44_4_ = local_278._reader._44_4_;
    writeConversion(this,reader_03,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader(&message);
    capnp::_::PackedInputStream::~PackedInputStream((PackedInputStream *)&f);
    kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)segments);
    kj::Array<capnp::word>::~Array(&words);
    kj::ArrayBuilder<unsigned_char>::dispose(&allBytes.builder);
    break;
  case TEXT:
    readOneText((String *)segments,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&message,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&f);
    TextCodec::setPrettyPrint((TextCodec *)&f,this->pretty);
    MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
              ((Builder *)&words,(MessageBuilder *)&message,
               (StructSchema)(this->rootType).super_Schema.raw);
    pwVar2 = segments[0].ptr;
    if (segments[0].size_ == 0) {
      pwVar2 = (word *)0x2b02ed;
    }
    input_01.content.size_ = segments[0].size_ + (segments[0].size_ == 0);
    output_01.builder.segment = (SegmentBuilder *)words.size_;
    output_01.schema.super_Schema.raw = (Schema)(Schema)words.ptr;
    output_01.builder.capTable = (CapTableBuilder *)words.disposer;
    output_01.builder.data = pvStack_410;
    output_01.builder.pointers = local_408;
    output_01.builder._32_8_ = uStack_400;
    input_01.content.ptr = (char *)pwVar2;
    TextCodec::decode((TextCodec *)&f,input_01,output_01);
    DynamicStruct::Builder::asReader((Reader *)&allBytes,(Builder *)&words);
    reader_04._reader.capTable = (CapTableReader *)allBytes.builder.endPtr;
    reader_04._reader.segment = (SegmentReader *)allBytes.builder.pos;
    reader_04._reader.data = allBytes.builder.disposer;
    reader_04._reader.pointers = pWStack_3d8;
    reader_04._reader._32_8_ = local_3d0;
    reader_04._reader._40_8_ = uStack_3c8;
    writeConversion(this,reader_04,output);
    TextCodec::~TextCodec((TextCodec *)&f);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&message);
    goto LAB_001e4312;
  case JSON:
    readOneJson((String *)segments,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&message,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec((JsonCodec *)&f);
    JsonCodec::setPrettyPrint((JsonCodec *)&f,this->pretty);
    JsonCodec::handleByAnnotation((JsonCodec *)&f,(this->rootType).super_Schema.raw);
    MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
              ((Builder *)&words,(MessageBuilder *)&message,
               (StructSchema)(this->rootType).super_Schema.raw);
    pwVar2 = (word *)segments[0].size_;
    if (segments[0].size_ != 0) {
      pwVar2 = segments[0].ptr;
    }
    sVar3 = 0;
    if (segments[0].size_ != 0) {
      sVar3 = segments[0].size_ - 1;
    }
    output_00.builder.segment = (SegmentBuilder *)words.size_;
    output_00.schema.super_Schema.raw = (Schema)(Schema)words.ptr;
    output_00.builder.capTable = (CapTableBuilder *)words.disposer;
    output_00.builder.data = pvStack_410;
    output_00.builder.pointers = local_408;
    output_00.builder._32_8_ = uStack_400;
    input_00.size_ = sVar3;
    input_00.ptr = (char *)pwVar2;
    JsonCodec::decode((JsonCodec *)&f,input_00,output_00);
    DynamicStruct::Builder::asReader((Reader *)&allBytes,(Builder *)&words);
    reader_02._reader.capTable = (CapTableReader *)allBytes.builder.endPtr;
    reader_02._reader.segment = (SegmentReader *)allBytes.builder.pos;
    reader_02._reader.data = allBytes.builder.disposer;
    reader_02._reader.pointers = pWStack_3d8;
    reader_02._reader._32_8_ = local_3d0;
    reader_02._reader._40_8_ = uStack_3c8;
    writeConversion(this,reader_02,output);
    JsonCodec::~JsonCodec((JsonCodec *)&f);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&message);
LAB_001e4312:
    kj::Array<char>::~Array((Array<char> *)segments);
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher(&parseErrorCatcher);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes().begin(), words.asBytes().size());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(&dummy, sizeof(dummy), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }